

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetKeyOwnersForKeyChord(ImGuiKeyChord key_chord,ImGuiID owner_id,ImGuiInputFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  
  pIVar1 = GImGui;
  if (((uint)key_chord >> 0xc & 1) != 0) {
    GImGui->KeysOwnerData[0x96].OwnerNext = owner_id;
    pIVar1->KeysOwnerData[0x96].OwnerCurr = owner_id;
    bVar2 = (bool)((byte)((uint)flags >> 0x15) & 1);
    pIVar1->KeysOwnerData[0x96].LockUntilRelease = bVar2;
    bVar3 = true;
    if (((uint)flags >> 0x14 & 1) == 0) {
      bVar3 = bVar2;
    }
    pIVar1->KeysOwnerData[0x96].LockThisFrame = bVar3;
  }
  pIVar1 = GImGui;
  if (((uint)key_chord >> 0xd & 1) != 0) {
    GImGui->KeysOwnerData[0x97].OwnerNext = owner_id;
    pIVar1->KeysOwnerData[0x97].OwnerCurr = owner_id;
    bVar2 = (bool)((byte)((uint)flags >> 0x15) & 1);
    pIVar1->KeysOwnerData[0x97].LockUntilRelease = bVar2;
    bVar3 = true;
    if (((uint)flags >> 0x14 & 1) == 0) {
      bVar3 = bVar2;
    }
    pIVar1->KeysOwnerData[0x97].LockThisFrame = bVar3;
  }
  pIVar1 = GImGui;
  if (((uint)key_chord >> 0xe & 1) != 0) {
    GImGui->KeysOwnerData[0x98].OwnerNext = owner_id;
    pIVar1->KeysOwnerData[0x98].OwnerCurr = owner_id;
    bVar2 = (bool)((byte)((uint)flags >> 0x15) & 1);
    pIVar1->KeysOwnerData[0x98].LockUntilRelease = bVar2;
    bVar3 = true;
    if (((uint)flags >> 0x14 & 1) == 0) {
      bVar3 = bVar2;
    }
    pIVar1->KeysOwnerData[0x98].LockThisFrame = bVar3;
  }
  pIVar1 = GImGui;
  if ((short)key_chord < 0) {
    GImGui->KeysOwnerData[0x99].OwnerNext = owner_id;
    pIVar1->KeysOwnerData[0x99].OwnerCurr = owner_id;
    bVar2 = (bool)((byte)((uint)flags >> 0x15) & 1);
    pIVar1->KeysOwnerData[0x99].LockUntilRelease = bVar2;
    bVar3 = true;
    if (((uint)flags >> 0x14 & 1) == 0) {
      bVar3 = bVar2;
    }
    pIVar1->KeysOwnerData[0x99].LockThisFrame = bVar3;
  }
  pIVar1 = GImGui;
  if ((key_chord & 0xffff0fffU) != 0) {
    iVar4 = (key_chord & 0xffff0fffU) - 0x200;
    GImGui->KeysOwnerData[iVar4].OwnerNext = owner_id;
    pIVar1->KeysOwnerData[iVar4].OwnerCurr = owner_id;
    bVar2 = (bool)((byte)((uint)flags >> 0x15) & 1);
    pIVar1->KeysOwnerData[iVar4].LockUntilRelease = bVar2;
    bVar3 = true;
    if (((uint)flags >> 0x14 & 1) == 0) {
      bVar3 = bVar2;
    }
    pIVar1->KeysOwnerData[iVar4].LockThisFrame = bVar3;
    return;
  }
  return;
}

Assistant:

void ImGui::SetKeyOwnersForKeyChord(ImGuiKeyChord key_chord, ImGuiID owner_id, ImGuiInputFlags flags)
{
    if (key_chord & ImGuiMod_Ctrl)      { SetKeyOwner(ImGuiMod_Ctrl, owner_id, flags); }
    if (key_chord & ImGuiMod_Shift)     { SetKeyOwner(ImGuiMod_Shift, owner_id, flags); }
    if (key_chord & ImGuiMod_Alt)       { SetKeyOwner(ImGuiMod_Alt, owner_id, flags); }
    if (key_chord & ImGuiMod_Super)     { SetKeyOwner(ImGuiMod_Super, owner_id, flags); }
    if (key_chord & ~ImGuiMod_Mask_)    { SetKeyOwner((ImGuiKey)(key_chord & ~ImGuiMod_Mask_), owner_id, flags); }
}